

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_comparison_expression.cpp
# Opt level: O2

LogicalType *
duckdb::BoundComparisonExpression::BindComparison
          (LogicalType *__return_storage_ptr__,ClientContext *context,LogicalType *left_type,
          LogicalType *right_type,ExpressionType comparison_type)

{
  bool bVar1;
  BinderException *this;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  LogicalType::LogicalType(__return_storage_ptr__);
  bVar1 = TryBindComparison(context,left_type,right_type,__return_storage_ptr__,comparison_type);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,
             "Cannot mix values of type %s and %s - an explicit cast is required",&local_89);
  LogicalType::ToString_abi_cxx11_(&local_68,left_type);
  LogicalType::ToString_abi_cxx11_(&local_88,right_type);
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_48,&local_68,&local_88);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

LogicalType BoundComparisonExpression::BindComparison(ClientContext &context, const LogicalType &left_type,
                                                      const LogicalType &right_type, ExpressionType comparison_type) {
	LogicalType result_type;
	if (!BoundComparisonExpression::TryBindComparison(context, left_type, right_type, result_type, comparison_type)) {
		throw BinderException("Cannot mix values of type %s and %s - an explicit cast is required",
		                      left_type.ToString(), right_type.ToString());
	}
	return result_type;
}